

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_stats
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  parasail_result_t *ppVar11;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  ulong size;
  uint uVar30;
  int iVar31;
  int iVar32;
  int NWL;
  int NWS;
  int NWM;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  uint local_e4;
  int local_c4;
  int local_c0;
  int local_bc;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_stats_cold_8();
  }
  else {
    size = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sg_flags_stats_cold_7();
    }
    else if (open < 0) {
      parasail_sg_flags_stats_cold_6();
    }
    else if (gap < 0) {
      parasail_sg_flags_stats_cold_5();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sg_flags_stats_cold_4();
    }
    else {
      uVar12 = (ulong)(uint)_s1Len;
      if (matrix->type == 1) {
        if (_s1 == (char *)0x0) {
          parasail_sg_flags_stats_cold_3();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        if (_s1 == (char *)0x0) {
          parasail_sg_flags_stats_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sg_flags_stats_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      if (matrix->type != 0) {
        uVar12 = (ulong)(uint)matrix->length;
      }
      ppVar11 = parasail_result_new_stats();
      if (ppVar11 != (parasail_result_t *)0x0) {
        ppVar11->flag =
             (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
             (uint)(s2_end != 0) << 0xf | ppVar11->flag | 0x1410102;
        iVar15 = (int)uVar12;
        ptr = parasail_memalign_int(0x10,(long)iVar15);
        ptr_00 = parasail_memalign_int(0x10,size);
        uVar19 = (ulong)(s2Len + 1);
        ptr_01 = parasail_memalign_int(0x10,uVar19);
        ptr_02 = parasail_memalign_int(0x10,uVar19);
        ptr_03 = parasail_memalign_int(0x10,uVar19);
        ptr_04 = parasail_memalign_int(0x10,uVar19);
        ptr_05 = parasail_memalign_int(0x10,uVar19);
        ptr_06 = parasail_memalign_int(0x10,uVar19);
        ptr_07 = parasail_memalign_int(0x10,uVar19);
        ptr_08 = parasail_memalign_int(0x10,uVar19);
        if ((ptr_08 != (int *)0x0 && (ptr_07 != (int *)0x0 && ptr_06 != (int *)0x0)) &&
            ((ptr_05 != (int *)0x0 && (ptr_04 != (int *)0x0 && ptr_03 != (int *)0x0)) &&
            ((ptr_02 != (int *)0x0 && ptr_01 != (int *)0x0) &&
            (ptr_00 != (int *)0x0 && ptr != (int *)0x0)))) {
          if (0 < iVar15) {
            piVar5 = matrix->mapper;
            uVar19 = 0;
            do {
              ptr[uVar19] = piVar5[(byte)_s1[uVar19]];
              uVar19 = uVar19 + 1;
            } while (uVar12 != uVar19);
          }
          iVar8 = iVar15 + -1;
          iVar9 = s2Len + -1;
          piVar5 = matrix->mapper;
          uVar12 = 1;
          if (1 < s2Len) {
            uVar12 = size;
          }
          uVar19 = 0;
          do {
            ptr_00[uVar19] = piVar5[(byte)_s2[uVar19]];
            uVar19 = uVar19 + 1;
          } while (uVar12 != uVar19);
          *ptr_01 = 0;
          *ptr_02 = 0;
          *ptr_03 = 0;
          *ptr_04 = 0;
          *ptr_05 = -0x40000000;
          *ptr_06 = 0;
          *ptr_07 = 0;
          *ptr_08 = 0;
          if (s2_beg == 0) {
            iVar16 = -open;
            lVar20 = 0;
            do {
              *(int *)((long)ptr_01 + lVar20 + 4) = iVar16;
              *(undefined4 *)((long)ptr_02 + lVar20 + 4) = 0;
              *(undefined4 *)((long)ptr_03 + lVar20 + 4) = 0;
              *(undefined4 *)((long)ptr_04 + lVar20 + 4) = 0;
              *(undefined4 *)((long)ptr_05 + lVar20 + 4) = 0xc0000000;
              *(undefined4 *)((long)ptr_06 + lVar20 + 4) = 0;
              *(undefined4 *)((long)ptr_07 + lVar20 + 4) = 0;
              *(undefined4 *)((long)ptr_08 + lVar20 + 4) = 0;
              iVar16 = iVar16 - gap;
              lVar20 = lVar20 + 4;
            } while (uVar12 * 4 != lVar20);
          }
          else {
            lVar20 = 0;
            do {
              *(undefined4 *)((long)ptr_01 + lVar20 + 4) = 0;
              *(undefined4 *)((long)ptr_02 + lVar20 + 4) = 0;
              *(undefined4 *)((long)ptr_03 + lVar20 + 4) = 0;
              *(undefined4 *)((long)ptr_04 + lVar20 + 4) = 0;
              *(undefined4 *)((long)ptr_05 + lVar20 + 4) = 0xc0000000;
              *(undefined4 *)((long)ptr_06 + lVar20 + 4) = 0;
              *(undefined4 *)((long)ptr_07 + lVar20 + 4) = 0;
              *(undefined4 *)((long)ptr_08 + lVar20 + 4) = 0;
              lVar20 = lVar20 + 4;
            } while (uVar12 * 4 != lVar20);
          }
          local_114 = iVar8;
          if (iVar15 < 1) {
            local_e4 = 0xc0000000;
            local_108 = -0x40000000;
            local_110 = -0x40000000;
            local_10c = -0x40000000;
          }
          else {
            uVar12 = 1;
            if (1 < s2Len) {
              uVar12 = size;
            }
            local_10c = -0x40000000;
            uVar19 = 1;
            local_110 = -0x40000000;
            local_108 = -0x40000000;
            local_e4 = 0xc0000000;
            do {
              if (matrix->type == 0) {
                iVar16 = matrix->size;
                lVar20 = (long)ptr[uVar19 - 1];
              }
              else {
                iVar16 = matrix->size;
                lVar20 = uVar19 - 1;
              }
              piVar5 = matrix->matrix;
              uVar25 = 0;
              iVar31 = *ptr_01;
              iVar28 = *ptr_02;
              iVar29 = *ptr_03;
              uVar26 = (ulong)(uint)((1 - (int)uVar19) * gap - open);
              if (s1_beg != 0) {
                uVar26 = uVar25;
              }
              iVar21 = *ptr_04;
              *ptr_01 = (int)uVar26;
              *ptr_02 = 0;
              *ptr_03 = 0;
              *ptr_04 = 0;
              uVar10 = 0xc0000000;
              local_bc = 0;
              local_c0 = 0;
              local_c4 = 0;
              iVar32 = 0;
              iVar23 = 0;
              iVar22 = 0;
              do {
                iVar1 = *(int *)((long)ptr_01 + uVar25 + 4);
                iVar2 = *(int *)((long)ptr_02 + uVar25 + 4);
                iVar3 = *(int *)((long)ptr_03 + uVar25 + 4);
                uVar30 = iVar1 - open;
                uVar24 = *(int *)((long)ptr_05 + uVar25 + 4) - gap;
                uVar6 = uVar24;
                if ((int)uVar24 < (int)uVar30) {
                  uVar6 = uVar30;
                }
                iVar4 = *(int *)((long)ptr_04 + uVar25 + 4);
                *(uint *)((long)ptr_05 + uVar25 + 4) = uVar6;
                uVar17 = (int)uVar26 - open;
                uVar13 = uVar10 - gap;
                uVar10 = uVar17;
                if ((int)uVar17 <= (int)uVar13) {
                  uVar10 = uVar13;
                }
                uVar27 = iVar31 + piVar5[lVar20 * iVar16 + (long)*(int *)((long)ptr_00 + uVar25)];
                uVar7 = uVar10;
                if ((int)uVar10 < (int)uVar27) {
                  uVar7 = uVar27;
                }
                if ((int)uVar7 <= (int)uVar6) {
                  uVar7 = uVar6;
                }
                uVar26 = (ulong)uVar7;
                if ((int)uVar24 < (int)uVar30) {
                  *(int *)((long)ptr_06 + uVar25 + 4) = iVar2;
                  *(int *)((long)ptr_07 + uVar25 + 4) = iVar3;
                  *(int *)((long)ptr_08 + uVar25 + 4) = iVar4;
                }
                iVar31 = *(int *)((long)ptr_08 + uVar25 + 4) + 1;
                *(int *)((long)ptr_08 + uVar25 + 4) = iVar31;
                iVar18 = iVar22;
                iVar14 = iVar23;
                if ((int)uVar17 <= (int)uVar13) {
                  iVar18 = local_c4;
                  iVar14 = local_c0;
                  iVar32 = local_bc;
                }
                local_bc = iVar32 + 1;
                if (uVar7 == uVar27) {
                  iVar32 = iVar21 + 1;
                  iVar22 = iVar28 + (uint)(ptr[uVar19 - 1] == *(int *)((long)ptr_00 + uVar25));
                  iVar23 = iVar29 + (uint)(0 < piVar5[lVar20 * iVar16 +
                                                      (long)*(int *)((long)ptr_00 + uVar25)]);
                }
                else {
                  iVar32 = local_bc;
                  iVar22 = iVar18;
                  iVar23 = iVar14;
                  if (uVar7 == *(uint *)((long)ptr_05 + uVar25 + 4)) {
                    iVar22 = *(int *)((long)ptr_06 + uVar25 + 4);
                    iVar23 = *(int *)((long)ptr_07 + uVar25 + 4);
                    iVar32 = iVar31;
                  }
                }
                *(uint *)((long)ptr_01 + uVar25 + 4) = uVar7;
                *(int *)((long)ptr_02 + uVar25 + 4) = iVar22;
                *(int *)((long)ptr_03 + uVar25 + 4) = iVar23;
                *(int *)((long)ptr_04 + uVar25 + 4) = iVar32;
                uVar25 = uVar25 + 4;
                iVar31 = iVar1;
                iVar28 = iVar2;
                iVar29 = iVar3;
                iVar21 = iVar4;
                local_c4 = iVar18;
                local_c0 = iVar14;
              } while (uVar12 << 2 != uVar25);
              if ((s1_end != 0) && ((int)local_e4 < (int)uVar7)) {
                local_114 = (int)uVar19 + -1;
                local_110 = iVar23;
                local_10c = iVar32;
                local_108 = iVar22;
                local_e4 = uVar7;
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != iVar15 + 1);
          }
          iVar15 = iVar9;
          if (s1_end == 0 || s2_end == 0) {
            if (s2_end != 0) {
              uVar12 = 1;
              if (1 < s2Len) {
                uVar12 = size;
              }
              uVar19 = 0;
              do {
                if ((int)local_e4 < ptr_01[uVar19 + 1]) {
                  local_108 = ptr_02[uVar19 + 1];
                  local_110 = ptr_03[uVar19 + 1];
                  local_10c = ptr_04[uVar19 + 1];
                  iVar15 = (int)uVar19;
                  local_e4 = ptr_01[uVar19 + 1];
                  local_114 = iVar8;
                }
                uVar19 = uVar19 + 1;
              } while (uVar12 != uVar19);
            }
          }
          else {
            uVar12 = 1;
            if (1 < s2Len) {
              uVar12 = size;
            }
            iVar16 = 1;
            uVar19 = 0;
            do {
              uVar26 = uVar19 + 1;
              uVar10 = ptr_01[uVar19 + 1];
              if ((int)local_e4 < (int)uVar10) {
                local_108 = ptr_02[uVar19 + 1];
                local_110 = ptr_03[uVar19 + 1];
                local_10c = ptr_04[uVar19 + 1];
                iVar15 = (int)uVar19;
                local_e4 = uVar10;
                local_114 = iVar8;
              }
              else if ((uVar10 == local_e4) && ((long)uVar26 <= (long)iVar15)) {
                iVar15 = iVar16 + -1;
                local_108 = ptr_02[uVar19 + 1];
                local_110 = ptr_03[uVar19 + 1];
                local_10c = ptr_04[uVar19 + 1];
                local_114 = iVar8;
              }
              iVar16 = iVar16 + 1;
              uVar19 = uVar26;
            } while (uVar12 != uVar26);
          }
          if (s2_end == 0 && s1_end == 0) {
            local_e4 = ptr_01[size];
            local_108 = ptr_02[size];
            local_110 = ptr_03[size];
            local_10c = ptr_04[size];
            iVar15 = iVar9;
            local_114 = iVar8;
          }
          ppVar11->score = local_e4;
          ppVar11->end_query = local_114;
          ppVar11->end_ref = iVar15;
          ((ppVar11->field_4).stats)->matches = local_108;
          ((ppVar11->field_4).stats)->similar = local_110;
          ((ppVar11->field_4).stats)->length = local_10c;
          parasail_free(ptr_08);
          parasail_free(ptr_07);
          parasail_free(ptr_06);
          parasail_free(ptr_05);
          parasail_free(ptr_04);
          parasail_free(ptr_03);
          parasail_free(ptr_02);
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          return ppVar11;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict HM = NULL;
    int * restrict HS = NULL;
    int * restrict HL = NULL;
    int * restrict F = NULL;
    int * restrict FM = NULL;
    int * restrict FS = NULL;
    int * restrict FL = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int matches = 0;
    int similar = 0;
    int length = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    matches = NEG_INF_32;
    similar = NEG_INF_32;
    length = NEG_INF_32;
    end_query = s1Len-1;
    end_ref = s2Len-1;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    HM = parasail_memalign_int(16, s2Len+1);
    HS = parasail_memalign_int(16, s2Len+1);
    HL = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);
    FM = parasail_memalign_int(16, s2Len+1);
    FS = parasail_memalign_int(16, s2Len+1);
    FL = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!HM) return NULL;
    if (!HS) return NULL;
    if (!HL) return NULL;
    if (!F) return NULL;
    if (!FM) return NULL;
    if (!FS) return NULL;
    if (!FL) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    HM[0] = 0;
    HS[0] = 0;
    HL[0] = 0;
    F[0] = NEG_INF_32;
    FM[0] = 0;
    FS[0] = 0;
    FL[0] = 0;
    
    /* first row */
    if (s2_beg) {
        for (j=1; j<=s2Len; ++j) {
            H[j] = 0;
            HM[j] = 0;
            HS[j] = 0;
            HL[j] = 0;
            F[j] = NEG_INF_32;
            FM[j] = 0;
            FS[j] = 0;
            FL[j] = 0;
        }
    }
    else {
        for (j=1; j<=s2Len; ++j) {
            H[j] = -open -(j-1)*gap;
            HM[j] = 0;
            HS[j] = 0;
            HL[j] = 0;
            F[j] = NEG_INF_32;
            FM[j] = 0;
            FS[j] = 0;
            FL[j] = 0;
        }
    }


    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int NHM = HM[0];
        int NHS = HS[0];
        int NHL = HL[0];
        int WH = s1_beg ? 0 : (-open - (i-1)*gap);
        int WHM = 0;
        int WHS = 0;
        int WHL = 0;
        int E = NEG_INF_32;
        int EM = 0;
        int ES = 0;
        int EL = 0;
        H[0] = WH;
        HM[0] = WHM;
        HS[0] = WHS;
        HL[0] = WHL;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            int NWM = NHM;
            int NWS = NHS;
            int NWL = NHL;
            NH = H[j];
            NHM = HM[j];
            NHS = HS[j];
            NHL = HL[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E - gap;
            E = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, E);
            WH = MAX(WH, F[j]);
            if (F_opn > F_ext) {
                FM[j] = NHM;
                FS[j] = NHS;
                FL[j] = NHL;
            }
            FL[j] += 1;
            if (E_opn > E_ext) {
                EM = WHM;
                ES = WHS;
                EL = WHL;
            }
            EL += 1;
            if (WH == H_dag) {
                WHM  = NWM + (s1[i-1] == s2[j-1]);
                WHS  = NWS + (matrow[s2[j-1]] > 0);
                WHL  = NWL + 1;
            }
            else if (WH == F[j]) {
                WHM  = FM[j];
                WHS  = FS[j];
                WHL  = FL[j];
            }
            else {
                WHM  = EM;
                WHS  = ES;
                WHL  = EL;
            }
            H[j] = WH;
            HM[j] = WHM;
            HS[j] = WHS;
            HL[j] = WHL;
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
            result->stats->tables->matches_table[1LL*(i-1)*s2Len + (j-1)] = WHM;
            result->stats->tables->similar_table[1LL*(i-1)*s2Len + (j-1)] = WHS;
            result->stats->tables->length_table[1LL*(i-1)*s2Len + (j-1)] = WHL;
#endif
        }
        if (s1_end && WH > score) {
            score = WH;
            matches = WHM;
            similar = WHS;
            length = WHL;
            end_query = i-1;
            end_ref = s2Len-1;
        }
#ifdef PARASAIL_ROWCOL
        result->stats->rowcols->score_col[i-1] = WH;
        result->stats->rowcols->matches_col[i-1] = WHM;
        result->stats->rowcols->similar_col[i-1] = WHS;
        result->stats->rowcols->length_col[i-1] = WHL;
#endif
    }
    if (s1_end && s2_end) {
        for (j=1; j<=s2Len; ++j) {
            i = s1Len;
            if (H[j] > score) {
                score = H[j];
                matches = HM[j];
                similar = HS[j];
                length = HL[j];
                end_query = i-1;
                end_ref = j-1;
            }
            else if (score == H[j] && j-1 < end_ref) {
                matches = HM[j];
                similar = HS[j];
                length = HL[j];
                end_query = i-1;
                end_ref = j-1;
            }
        }
    }
    else if (s2_end) {
        for (j=1; j<=s2Len; ++j) {
            i = s1Len;
            if (H[j] > score) {
                score = H[j];
                matches = HM[j];
                similar = HS[j];
                length = HL[j];
                end_query = i-1;
                end_ref = j-1;
            }
        }
    }
    if (!s1_end && !s2_end) {
        score = H[s2Len];
        matches = HM[s2Len];
        similar = HS[s2Len];
        length = HL[s2Len];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->stats->rowcols->score_row[j-1] = H[j];
        result->stats->rowcols->matches_row[j-1] = HM[j];
        result->stats->rowcols->similar_row[j-1] = HS[j];
        result->stats->rowcols->length_row[j-1] = HL[j];
    }
#endif

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(FL);
    parasail_free(FS);
    parasail_free(FM);
    parasail_free(F);
    parasail_free(HL);
    parasail_free(HS);
    parasail_free(HM);
    parasail_free(H);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}